

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void freecookie(Cookie *co)

{
  if (co->expirestr != (char *)0x0) {
    (*Curl_cfree)(co->expirestr);
  }
  if (co->domain != (char *)0x0) {
    (*Curl_cfree)(co->domain);
  }
  if (co->path != (char *)0x0) {
    (*Curl_cfree)(co->path);
  }
  if (co->spath != (char *)0x0) {
    (*Curl_cfree)(co->spath);
  }
  if (co->name != (char *)0x0) {
    (*Curl_cfree)(co->name);
  }
  if (co->value != (char *)0x0) {
    (*Curl_cfree)(co->value);
  }
  if (co->maxage != (char *)0x0) {
    (*Curl_cfree)(co->maxage);
  }
  if (co->version != (char *)0x0) {
    (*Curl_cfree)(co->version);
  }
  (*Curl_cfree)(co);
  return;
}

Assistant:

static void freecookie(struct Cookie *co)
{
  if(co->expirestr)
    free(co->expirestr);
  if(co->domain)
    free(co->domain);
  if(co->path)
    free(co->path);
  if(co->spath)
    free(co->spath);
  if(co->name)
    free(co->name);
  if(co->value)
    free(co->value);
  if(co->maxage)
    free(co->maxage);
  if(co->version)
    free(co->version);

  free(co);
}